

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition
               (sysbvm_context_t *context,sysbvm_functionDefinition_t *definition_)

{
  undefined1 auVar1 [16];
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar2;
  anon_struct_8_2_b06356a8_for_anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0_1 aVar3;
  sysbvm_tuple_t *psVar4;
  undefined4 uVar5;
  _Bool _Var6;
  byte bVar7;
  byte bVar8;
  short sVar9;
  size_t i;
  ulong uVar10;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar11;
  size_t sVar12;
  sysbvm_tuple_t sVar13;
  ulong uVar14;
  short sVar15;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *next;
  undefined8 uVar16;
  sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand_5;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar17;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar18;
  sysbvm_functionBytecodeAssemblerVectorOperand_t *vectorOperand_1;
  ulong uVar19;
  size_t sVar20;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar21;
  byte *pbVar22;
  long lVar23;
  sysbvm_tuple_t sVar24;
  ulong uVar25;
  long lVar26;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar27;
  uint uVar28;
  size_t pc;
  sysbvm_functionBytecodeAssembler_t *psVar29;
  uint64_t value;
  sysbvm_functionBytecodeAssemblerInstruction_t *bytecodeInstruction;
  long *plVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  sysbvm_functionDefinition_t *local_d0;
  sysbvm_tuple_t local_c8;
  sysbvm_functionBytecodeDirectCompiler_t *psStack_c0;
  sysbvm_tuple_t local_b8;
  sysbvm_object_tuple_t *psStack_b0;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  ulong local_90;
  long local_88;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **local_80;
  long local_78;
  long local_70;
  long local_68;
  byte *local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_functionDefinition_t **local_40;
  
  local_40 = &local_d0;
  local_a8 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0;
  sStack_a0 = 0;
  local_b8 = 0;
  psStack_b0 = (sysbvm_object_tuple_t *)0x0;
  local_c8 = 0;
  psStack_c0 = (sysbvm_functionBytecodeDirectCompiler_t *)0x0;
  local_98 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 8;
  local_d0 = definition_;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_c8 = local_d0->sourceAnalyzedDefinition;
  psStack_c0 = (sysbvm_functionBytecodeDirectCompiler_t *)
               sysbvm_functionBytecodeDirectCompiler_create(context);
  psVar29 = psStack_c0->assembler;
  sVar13 = *(sysbvm_tuple_t *)(local_c8 + 0x18);
  psVar29->sourcePosition = *(sysbvm_tuple_t *)(local_c8 + 0x10);
  psVar29->sourceEnvironment = sVar13;
  uVar10 = *(ulong *)(local_c8 + 0x28);
  if (uVar10 == 0 || (uVar10 & 0xf) != 0) {
    sysbvm_functionBytecodeAssembler_setArgumentCount(context,psVar29,0);
  }
  else {
    uVar28 = *(uint *)(uVar10 + 0xc);
    uVar10 = (ulong)(uVar28 >> 3);
    sysbvm_functionBytecodeAssembler_setArgumentCount(context,psVar29,uVar10);
    if (7 < uVar28) {
      uVar19 = 0;
      do {
        uVar14 = *(ulong *)(local_c8 + 0x28);
        if ((uVar14 & 0xf) == 0 && uVar14 != 0) {
          sVar13 = *(sysbvm_tuple_t *)(uVar14 + 0x10 + uVar19 * 8);
        }
        else {
          sVar13 = 0;
        }
        uVar14 = psStack_c0->assembler->arguments;
        if ((uVar14 & 0xf) == 0 && uVar14 != 0) {
          sVar24 = *(sysbvm_tuple_t *)(uVar14 + 0x10 + uVar19 * 8);
        }
        else {
          sVar24 = 0;
        }
        sysbvm_methodDictionary_atPut(context,psStack_c0->bindingDictionary,sVar13,sVar24);
        uVar19 = uVar19 + 1;
      } while (uVar10 != uVar19);
    }
  }
  uVar10 = *(ulong *)(local_c8 + 0x20);
  if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
    sVar12 = (size_t)(*(uint *)(uVar10 + 0xc) >> 3);
  }
  else {
    sVar12 = 0;
  }
  sysbvm_functionBytecodeAssembler_setCaptureCount(context,psStack_c0->assembler,sVar12);
  if (sVar12 != 0) {
    sVar20 = 0;
    do {
      uVar10 = *(ulong *)(local_c8 + 0x20);
      if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
        sVar13 = *(sysbvm_tuple_t *)(uVar10 + 0x10 + sVar20 * 8);
      }
      else {
        sVar13 = 0;
      }
      uVar10 = psStack_c0->assembler->captures;
      if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
        sVar24 = *(sysbvm_tuple_t *)(uVar10 + 0x10 + sVar20 * 8);
      }
      else {
        sVar24 = 0;
      }
      sysbvm_methodDictionary_atPut(context,psStack_c0->bindingDictionary,sVar13,sVar24);
      sVar20 = sVar20 + 1;
    } while (sVar12 != sVar20);
  }
  if (*(sysbvm_tuple_t *)(local_c8 + 0x48) == 0) {
    local_b8 = sysbvm_functionBytecodeAssembler_addLiteral(context,psStack_c0->assembler,0x2f);
  }
  else {
    local_b8 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,psStack_c0,*(sysbvm_tuple_t *)(local_c8 + 0x48));
  }
  if (local_b8 != 0) {
    sysbvm_functionBytecodeAssembler_return(context,psStack_c0->assembler,local_b8);
  }
  psVar29 = psStack_c0->assembler;
  if (psVar29->firstInstruction != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    psVar21 = psVar29->firstInstruction;
    do {
      psVar27 = psVar21->next;
      _Var6 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar21);
      if (((!_Var6) &&
          (uVar10 = psVar21[1].super.header.field_0.typePointer >> 4, (byte)uVar10 < 0x27)) &&
         ((0x6000020000U >> (uVar10 & 0x3f) & 1) != 0)) {
        uVar10 = *(ulong *)&psVar21[1].super.header.identityHashAndFlags;
        if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
          psVar11 = *(sysbvm_functionBytecodeAssemblerAbstractInstruction_s **)
                     ((ulong)(*(uint *)(uVar10 + 0xc) & 0xfffffff8) + 8 + uVar10);
        }
        else {
          psVar11 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0;
        }
        if (psVar11 == psVar27) {
          psVar11 = psVar21->previous;
          psVar2 = psVar21->next;
          ppsVar17 = &psVar11->next;
          if (psVar11 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
            ppsVar17 = &psVar29->firstInstruction;
          }
          *ppsVar17 = psVar2;
          ppsVar17 = &psVar2->previous;
          if (psVar2 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
            ppsVar17 = &psVar29->lastInstruction;
          }
          *ppsVar17 = psVar11;
        }
      }
      psVar21 = psVar27;
    } while (psVar27 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0);
    psVar29 = psStack_c0->assembler;
  }
  sVar12 = sysbvm_orderedCollection_getSize(psVar29->temporaries);
  if (sVar12 != 0) {
    sVar20 = 0;
    do {
      sVar13 = sysbvm_orderedCollection_at(psVar29->temporaries,sVar20);
      *(undefined8 *)(sVar13 + 0x20) = 0xf;
      *(undefined8 *)(sVar13 + 0x28) = 0xf;
      *(undefined8 *)(sVar13 + 0x30) = 0xf;
      *(undefined8 *)(sVar13 + 0x38) = 0xf;
      *(undefined8 *)(sVar13 + 0x40) = 0xf;
      *(undefined8 *)(sVar13 + 0x48) = 0xf;
      sVar20 = sVar20 + 1;
    } while (sVar12 != sVar20);
  }
  psVar21 = psVar29->firstInstruction;
  if (psVar21 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    local_80 = &psVar29->firstInstruction;
    do {
      _Var6 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar21);
      if (!_Var6) {
        uVar28 = psVar21[1].super.header.field_0.field_1.typePointer32 >> 4;
        bVar8 = (byte)uVar28;
        if (bVar8 != 0x1f) {
          bVar7 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(bVar8);
          uVar10 = *(ulong *)&psVar21[1].super.header.identityHashAndFlags;
          bVar31 = (uVar10 & 0xf) != 0;
          if (bVar31 || uVar10 == 0) {
            uVar19 = 0;
          }
          else {
            uVar19 = (ulong)(*(uint *)(uVar10 + 0xc) >> 3);
          }
          if ((bVar8 < 0x27) && ((0x6000020000U >> ((ulong)(uVar28 & 0xff) & 0x3f) & 1) != 0)) {
            uVar19 = uVar19 - 1;
          }
          uVar14 = (ulong)bVar7;
          if (bVar7 != 0) {
            uVar25 = 0;
            do {
              if ((!bVar31 && uVar10 != 0) &&
                 (lVar23 = *(long *)(uVar10 + 0x10 + uVar25 * 8), lVar23 != 0)) {
                if ((bVar8 & 0xef) == 0x20) {
                  *(undefined8 *)(lVar23 + 0x20) = 0x1f;
LAB_0014536f:
                  lVar26 = 0x38;
                }
                else {
                  *(undefined8 *)(lVar23 + 0x28) = 0x1f;
                  lVar26 = 0x30;
                  if (bVar8 != 0x37) goto LAB_0014536f;
                }
                *(undefined8 *)(lVar23 + lVar26) = 0x1f;
              }
              uVar25 = uVar25 + 1;
            } while (uVar14 != uVar25);
          }
          if (uVar14 < uVar19) {
            do {
              lVar23 = (ulong)(uVar14 != 0) * 8 + 0x40;
              if (bVar8 != 0x24) {
                lVar23 = 0x48;
              }
              if (bVar8 == 0x22) {
                lVar23 = 0x40;
              }
              *(undefined8 *)(*(long *)(uVar10 + 0x10 + uVar14 * 8) + lVar23) = 0x1f;
              uVar14 = uVar14 + 1;
            } while (uVar19 != uVar14);
          }
        }
      }
      ppsVar17 = local_80;
      psVar21 = psVar21->next;
    } while (psVar21 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0);
    if (*local_80 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
      psVar27 = *local_80;
      do {
        psVar11 = psVar27->next;
        _Var6 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar27);
        if (!_Var6) {
          uVar28 = psVar27[1].super.header.field_0.field_1.typePointer32 >> 4 & 0xff;
          if (uVar28 < 0x24) {
            if (uVar28 == 0x20) {
              lVar23 = *(long *)&psVar27[1].super.header.identityHashAndFlags;
              lVar26 = *(long *)(lVar23 + 0x10);
              if ((((*(long *)(lVar26 + 0x20) == 0x1f) && (*(long *)(lVar26 + 0x28) != 0x1f)) &&
                  (*(long *)(lVar26 + 0x40) == 0x1f)) && (*(long *)(lVar26 + 0x48) != 0x1f)) {
                psVar27[1].super.header.field_0.typePointer = 0x213;
                sVar13 = sysbvm_functionBytecodeAssembler_addLiteral(context,psVar29,0);
                *(sysbvm_tuple_t *)(lVar23 + 0x18) = sVar13;
                uVar10 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
                sVar13 = 0;
                if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
                  sVar13 = *(sysbvm_tuple_t *)(uVar10 + 0x10);
                }
                sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(context,psVar29,sVar13);
              }
            }
            else if (uVar28 == 0x22) {
              lVar23 = *(long *)(*(long *)&psVar27[1].super.header.identityHashAndFlags + 0x18);
              if (((*(long *)(lVar23 + 0x20) == 0x1f) && (*(long *)(lVar23 + 0x28) != 0x1f)) &&
                 ((*(long *)(lVar23 + 0x40) == 0x1f && (*(long *)(lVar23 + 0x48) != 0x1f))))
              goto LAB_00145553;
              if (((*(long *)(lVar23 + 0x30) == 0x1f) && (*(long *)(lVar23 + 0x38) != 0x1f)) &&
                 ((*(long *)(lVar23 + 0x40) == 0x1f && (*(long *)(lVar23 + 0x48) != 0x1f)))) {
                sVar13 = sysbvm_array_create(context,3);
                uVar10 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
                if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
                  uVar16 = *(undefined8 *)(uVar10 + 0x10);
                }
                else {
                  uVar16 = 0;
                }
                if ((sVar13 & 0xf) == 0 && sVar13 != 0) {
                  *(undefined8 *)(sVar13 + 0x10) = uVar16;
                  *(undefined8 *)(sVar13 + 0x18) = *(undefined8 *)(lVar23 + 0x58);
                  *(undefined8 *)(sVar13 + 0x20) = *(undefined8 *)(lVar23 + 0x60);
                }
                psVar27[1].super.header.field_0.typePointer = 0x363;
                goto LAB_00145755;
              }
            }
          }
          else if (uVar28 == 0x24) {
            lVar23 = *(long *)(*(long *)&psVar27[1].super.header.identityHashAndFlags + 0x10);
            if ((((*(long *)(lVar23 + 0x20) == 0x1f) && (*(long *)(lVar23 + 0x28) != 0x1f)) &&
                (*(long *)(lVar23 + 0x40) == 0x1f)) && (*(long *)(lVar23 + 0x48) != 0x1f)) {
LAB_00145553:
              psVar27[1].super.header.field_0.typePointer = 0x213;
            }
            else if (((*(long *)(lVar23 + 0x30) == 0x1f) && (*(long *)(lVar23 + 0x38) != 0x1f)) &&
                    ((*(long *)(lVar23 + 0x40) == 0x1f && (*(long *)(lVar23 + 0x48) != 0x1f)))) {
              sVar13 = sysbvm_array_create(context,3);
              bVar31 = (sVar13 & 0xf) == 0;
              if (bVar31 && sVar13 != 0) {
                *(undefined8 *)(sVar13 + 0x10) = *(undefined8 *)(lVar23 + 0x58);
                *(undefined8 *)(sVar13 + 0x18) = *(undefined8 *)(lVar23 + 0x60);
              }
              uVar10 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
              if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
                uVar16 = *(undefined8 *)(uVar10 + 0x18);
              }
              else {
                uVar16 = 0;
              }
              if (bVar31 && sVar13 != 0) {
                *(undefined8 *)(sVar13 + 0x20) = uVar16;
              }
              psVar27[1].super.header.field_0.typePointer = 899;
              goto LAB_00145755;
            }
          }
          else if (uVar28 == 0x30) {
            sVar13 = *(sysbvm_tuple_t *)
                      (*(long *)&psVar27[1].super.header.identityHashAndFlags + 0x10);
            if (((*(long *)(sVar13 + 0x20) == 0x1f) && (*(long *)(sVar13 + 0x28) != 0x1f)) &&
               ((*(long *)(sVar13 + 0x40) == 0x1f && (*(long *)(sVar13 + 0x48) != 0x1f)))) {
              sysbvm_functionBytecodeAssembler_lowerTemporaryPointerRank(context,psVar29,sVar13);
              sVar13 = sysbvm_array_create(context,2);
              uVar10 = *(ulong *)&psVar27[1].super.header.identityHashAndFlags;
              if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
                uVar16 = *(undefined8 *)(uVar10 + 0x10);
              }
              else {
                uVar16 = 0;
              }
              bVar31 = (sVar13 & 0xf) == 0;
              if (bVar31 && sVar13 != 0) {
                *(undefined8 *)(sVar13 + 0x10) = uVar16;
                uVar10._0_4_ = psVar27[1].super.header.identityHashAndFlags;
                uVar10._4_4_ = psVar27[1].super.header.objectSize;
              }
              if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
                uVar16 = *(undefined8 *)(uVar10 + 0x20);
              }
              else {
                uVar16 = 0;
              }
              if (bVar31 && sVar13 != 0) {
                *(undefined8 *)(sVar13 + 0x18) = uVar16;
              }
              psVar27[1].super.header.field_0.typePointer = 0x213;
LAB_00145755:
              psVar27[1].super.header.identityHashAndFlags = (int)sVar13;
              psVar27[1].super.header.objectSize = (int)(sVar13 >> 0x20);
            }
          }
          else if (uVar28 == 0x37) {
            lVar23 = *(long *)&psVar27[1].super.header.identityHashAndFlags;
            lVar26 = *(long *)(lVar23 + 0x10);
            if ((((*(long *)(lVar26 + 0x30) == 0x1f) && (*(long *)(lVar26 + 0x38) != 0x1f)) &&
                (*(long *)(lVar26 + 0x40) == 0x1f)) && (*(long *)(lVar26 + 0x48) != 0x1f)) {
              *(undefined8 *)(lVar26 + 0x58) = *(undefined8 *)(lVar23 + 0x18);
              *(undefined8 *)(lVar26 + 0x60) = *(undefined8 *)(lVar23 + 0x20);
              psVar2 = psVar27->previous;
              psVar27 = psVar27->next;
              ppsVar18 = &psVar2->next;
              if (psVar2 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
                ppsVar18 = ppsVar17;
              }
              *ppsVar18 = psVar27;
              ppsVar18 = &psVar27->previous;
              if (psVar27 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0) {
                ppsVar18 = &psVar29->lastInstruction;
              }
              *ppsVar18 = psVar2;
            }
          }
        }
        psVar27 = psVar11;
      } while (psVar11 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0);
    }
  }
  sVar12 = sysbvm_orderedCollection_getSize(psStack_c0->assembler->temporaries);
  if (sVar12 + 0x800000000000000 >> 0x3c == 0) {
    uVar10 = sVar12 << 4 | 0xb;
  }
  else {
    uVar10 = sysbvm_tuple_uint64_encodeBig(context,sVar12);
  }
  psStack_c0->assembler->usedTemporaryCount = uVar10;
  psStack_b0 = sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionBytecodeType,0x12);
  psVar29 = psStack_c0->assembler;
  uVar10 = psVar29->arguments;
  sVar13 = 0xb;
  sVar24 = 0xb;
  if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
    sVar24 = (ulong)(*(uint *)(uVar10 + 0xc) >> 3) << 4 | 0xb;
  }
  (psStack_b0->field_1).pointers[0] = sVar24;
  uVar10 = psVar29->captures;
  if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
    sVar13 = (ulong)(*(uint *)(uVar10 + 0xc) >> 3) << 4 | 0xb;
  }
  psStack_b0[1].header.field_0.typePointer = sVar13;
  uVar5 = *(undefined4 *)((long)&psVar29->usedTemporaryCount + 4);
  psStack_b0[1].header.identityHashAndFlags = *(undefined4 *)&psVar29->usedTemporaryCount;
  psStack_b0[1].header.objectSize = uVar5;
  sVar13 = sysbvm_orderedCollection_asArray(context,psVar29->literals);
  psStack_b0[1].field_1.pointers[0] = sVar13;
  *(sysbvm_functionDefinition_t **)&psStack_b0[2].header.identityHashAndFlags = local_d0;
  auVar1 = *(undefined1 (*) [16])(local_c8 + 0x20);
  auVar32._0_8_ = auVar1._8_8_;
  auVar32._8_4_ = auVar1._0_4_;
  auVar32._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])&psStack_b0[2].field_1 = auVar32;
  sVar13 = sysbvm_orderedCollection_asArray(context,psStack_c0->assembler->temporaryTypes);
  psStack_b0[3].header.identityHashAndFlags = (int)sVar13;
  psStack_b0[3].header.objectSize = (int)(sVar13 >> 0x20);
  psStack_b0[4].field_1.pointers[0] = 0xc;
  psStack_b0[5].header.field_0.typePointer = 0xc;
  psStack_b0[5].header.identityHashAndFlags = 0xc;
  psStack_b0[5].header.objectSize = 0;
  psStack_b0[5].field_1.pointers[0] = 0xc;
  psStack_b0[6].header.field_0.typePointer = 0xc;
  psStack_b0[6].header.identityHashAndFlags = 0xc;
  psStack_b0[6].header.objectSize = 0;
  psStack_b0[3].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(local_c8 + 0x10);
  sStack_a0 = sysbvm_orderedOffsetTableBuilder_create(context);
  local_98 = sysbvm_orderedOffsetTableBuilder_create(context);
  local_a8 = psStack_c0->assembler->firstInstruction;
  if (local_a8 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    sVar13 = 0;
  }
  else {
    value = 0;
    do {
      if (value + 0x800000000000000 < 0x1000000000000000) {
        uVar10 = value << 4 | 0xb;
      }
      else {
        uVar10 = sysbvm_tuple_uint64_encodeBig(context,value);
      }
      psVar21 = local_a8;
      local_a8->pc = uVar10;
      _Var6 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,local_a8);
      if (_Var6) {
        uVar19 = 0;
      }
      else {
        uVar10 = *(ulong *)&psVar21[1].super.header.identityHashAndFlags;
        uVar19 = 1;
        if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
          uVar19 = (ulong)(*(uint *)(uVar10 + 0xc) >> 2) | 1;
        }
      }
      sVar13 = uVar19 + value;
      if (sVar13 + 0x800000000000000 < 0x1000000000000000) {
        uVar10 = sVar13 * 0x10 | 0xb;
      }
      else {
        uVar10 = sysbvm_tuple_uint64_encodeBig(context,sVar13);
      }
      local_a8->endPC = uVar10;
      sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
                (context,sStack_a0,(uint32_t)value,local_a8->sourcePosition);
      sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
                (context,local_98,(uint32_t)value,local_a8->sourceEnvironment);
      local_a8 = local_a8->next;
      value = sVar13;
    } while (local_a8 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0);
  }
  local_a8 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0;
  sVar13 = sysbvm_byteArray_create(context,sVar13);
  psStack_b0[2].header.field_0.typePointer = sVar13;
  psVar21 = psStack_c0->assembler->firstInstruction;
  local_a8 = psVar21;
  if (psVar21 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    local_70 = sVar13 + 0x10;
    local_78 = sVar13 + 0x11;
    lVar23 = 0;
    do {
      local_a8 = psVar21;
      _Var6 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,psVar21);
      if (_Var6) {
        lVar26 = 0;
      }
      else {
        uVar10 = *(ulong *)&psVar21[1].super.header.identityHashAndFlags;
        if ((uVar10 & 0xf) == 0 && uVar10 != 0) {
          uVar10 = (ulong)(*(uint *)(uVar10 + 0xc) >> 3);
        }
        else {
          uVar10 = 0;
        }
        aVar3 = psVar21[1].super.header.field_0.field_1;
        bVar8 = (byte)((ulong)aVar3 >> 4);
        bVar7 = bVar8;
        if (0x3f < bVar8) {
          sysbvm_bytecodeInterpreter_ensureTablesAreFilled();
          bVar7 = sysbvm_implicitVariableBytecodeOperandCountTable[aVar3.typePointer32 >> 8 & 0xf];
          if ((uint)uVar10 < (uint)bVar7) {
            sysbvm_error_assertionFailure
                      (
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:770: assertion failure: operandCount >= implicitOperandCount"
                      );
          }
          bVar7 = ((byte)(uVar10 - bVar7 >> (bVar8 == 0xe0)) & 0xf) + bVar8;
        }
        local_60 = (byte *)(local_70 + lVar23);
        *local_60 = bVar7;
        bVar8 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(bVar8);
        if (uVar10 == 0) {
          lVar26 = 1;
        }
        else {
          local_80 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s **)(ulong)bVar8;
          uVar19 = (ulong)((uint)uVar10 * 2);
          local_88 = local_78 + lVar23;
          lVar26 = 1;
          plVar30 = (long *)0x0;
          uVar10 = 0;
          local_90 = uVar19;
          local_68 = lVar23;
          do {
            uVar14 = uVar10;
            uVar10 = *(ulong *)&psVar21[1].super.header.identityHashAndFlags;
            if (uVar10 == 0 || (uVar10 & 0xf) != 0) {
              pbVar22 = local_60 + lVar26;
LAB_00145b41:
              if (local_80 <= plVar30) {
                sysbvm_error("Invalid missing non-destination operand.");
              }
              pbVar22[0] = 0xff;
              pbVar22[1] = 0xff;
            }
            else {
              psVar4 = *(sysbvm_tuple_t **)(uVar10 + 0x10 + uVar14 * 4);
              if (psVar4 == (sysbvm_tuple_t *)0x0) {
                pbVar22 = (byte *)(local_88 + uVar14);
                goto LAB_00145b41;
              }
              uVar10 = (ulong)((uint)psVar4 & 0xf);
              if (uVar10 == 0xf) {
                sVar13 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar4 >> 4);
              }
              else if (uVar10 == 0) {
                sVar13 = *psVar4;
              }
              else {
                sVar13 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar10);
              }
              uVar19 = local_90;
              if ((sVar13 == (context->roots).functionBytecodeAssemblerInstruction) ||
                 (sVar13 == (context->roots).functionBytecodeAssemblerLabel)) {
                uVar10 = psVar4[2];
                if (uVar10 == 0 || (uVar10 & 0xf) != 0) {
                  sVar9 = (short)((long)uVar10 >> 4);
                }
                else {
                  sVar9 = (short)*(undefined8 *)(uVar10 + 0x10);
                }
                uVar10 = psVar21->endPC;
                if (uVar10 == 0 || (uVar10 & 0xf) != 0) {
                  sVar15 = (short)((long)uVar10 >> 4);
                }
                else {
                  sVar15 = (short)*(undefined8 *)(uVar10 + 0x10);
                }
                *(short *)(local_88 + uVar14) = sVar9 - sVar15;
              }
              else if (sVar13 == (context->roots).functionBytecodeAssemblerVectorOperand) {
                *(ushort *)(local_88 + uVar14) =
                     (ushort)((uint)psVar4[2] >> 2) & 0xfffc | (ushort)((uint)psVar4[3] >> 4);
              }
              else {
                if (sVar13 != (context->roots).int16Type) {
                  abort();
                }
                *(char *)(local_88 + uVar14) = (char)((ulong)psVar4 >> 4);
                *(char *)(local_88 + 1 + uVar14) = (char)((ulong)psVar4 >> 0xc);
              }
            }
            lVar26 = lVar26 + 2;
            plVar30 = (long *)((long)plVar30 + 1);
            uVar10 = uVar14 + 2;
          } while (uVar19 != uVar14 + 2);
          lVar26 = uVar14 + 3;
          lVar23 = local_68;
        }
      }
      lVar23 = lVar23 + lVar26;
      psVar21 = local_a8->next;
    } while (psVar21 != (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)0x0);
    local_a8 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0;
  }
  local_d0->bytecode = (sysbvm_tuple_t)psStack_b0;
  local_d0->sourceAnalyzedDefinition = 0;
  sVar13 = sysbvm_orderedOffsetTableBuilder_finish(context,sStack_a0);
  psStack_b0[4].header.field_0.typePointer = sVar13;
  sVar13 = sysbvm_orderedOffsetTableBuilder_finish(context,local_98);
  psStack_b0[4].header.identityHashAndFlags = (int)sVar13;
  psStack_b0[4].header.objectSize = (int)(sVar13 >> 0x20);
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition(sysbvm_context_t *context, sysbvm_functionDefinition_t *definition_)
{
    struct {
        sysbvm_functionDefinition_t *definition;
        sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t bodyResult;
        sysbvm_functionBytecode_t *bytecode;
        sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instruction;

        sysbvm_tuple_t debugSourcePositions;
        sysbvm_tuple_t debugSourceEnvironments;
    } gcFrame = {
        .definition = (sysbvm_functionDefinition_t*)definition_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.definition->sourceAnalyzedDefinition;

    gcFrame.compiler = (sysbvm_functionBytecodeDirectCompiler_t*)sysbvm_functionBytecodeDirectCompiler_create(context);
    gcFrame.compiler->assembler->sourceEnvironment = gcFrame.sourceAnalyzedDefinition->environment;
    gcFrame.compiler->assembler->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;

    {
        // Make the argument operands.
        size_t argumentCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->arguments);
        sysbvm_functionBytecodeAssembler_setArgumentCount(context, gcFrame.compiler->assembler, argumentCount);
        for(size_t i = 0; i < argumentCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->arguments, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->arguments, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }

        // Make the binding operands.
        size_t captureCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->captures);
        sysbvm_functionBytecodeAssembler_setCaptureCount(context, gcFrame.compiler->assembler, captureCount);
        for(size_t i = 0; i < captureCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->captures, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->captures, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }
    }

    // Compile the body.
    gcFrame.bodyResult = gcFrame.sourceAnalyzedDefinition->bodyNode
        ? sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, gcFrame.sourceAnalyzedDefinition->bodyNode)
        : sysbvm_functionBytecodeAssembler_addLiteral(context, gcFrame.compiler->assembler, SYSBVM_VOID_TUPLE);

    if(gcFrame.bodyResult)
        sysbvm_functionBytecodeAssembler_return(context, gcFrame.compiler->assembler, gcFrame.bodyResult);

    // Perform some optimizations.
    sysbvm_functionBytecodeAssembler_optimizeJumps(context, gcFrame.compiler->assembler);
    sysbvm_functionBytecodeAssembler_optimizeTemporaries(context, gcFrame.compiler->assembler);
    
    // Assemble the instructions.
    gcFrame.compiler->assembler->usedTemporaryCount = sysbvm_tuple_size_encode(context, sysbvm_orderedCollection_getSize(gcFrame.compiler->assembler->temporaries));

    gcFrame.bytecode = (sysbvm_functionBytecode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionBytecodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionBytecode_t));
    gcFrame.bytecode->argumentCount = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->arguments));
    gcFrame.bytecode->captureVectorSize = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->captures));
    gcFrame.bytecode->localVectorSize = gcFrame.compiler->assembler->usedTemporaryCount;
    gcFrame.bytecode->literalVector = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->literals);

    gcFrame.bytecode->definition = (sysbvm_tuple_t)gcFrame.definition;

    gcFrame.bytecode->arguments = gcFrame.sourceAnalyzedDefinition->arguments;
    gcFrame.bytecode->captures = gcFrame.sourceAnalyzedDefinition->captures;
    gcFrame.bytecode->temporaryTypes = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->temporaryTypes);

    gcFrame.bytecode->jittedCode = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    gcFrame.bytecode->jittedCodeTrampoline = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    // Tables for the debug information.
    gcFrame.bytecode->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;
    gcFrame.debugSourcePositions = sysbvm_orderedOffsetTableBuilder_create(context);
    gcFrame.debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_create(context);

    // Assemble the instructions.
    size_t instructionsOffset = 0;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
    {
        size_t pc = instructionsOffset;
        gcFrame.instruction->pc = sysbvm_tuple_size_encode(context, instructionsOffset);
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_computeAssembledSize(context, gcFrame.instruction);
        gcFrame.instruction->endPC = sysbvm_tuple_size_encode(context, instructionsOffset);

        // Add the debug annotations.
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourcePositions, (uint32_t)pc, gcFrame.instruction->sourcePosition);
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourceEnvironments, (uint32_t)pc, gcFrame.instruction->sourceEnvironment);
    }

    gcFrame.bytecode->instructions = sysbvm_byteArray_create(context, instructionsOffset);
    instructionsOffset = 0;
    uint8_t *destInstructions = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(gcFrame.bytecode->instructions)->bytes;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_assembleInto(context, gcFrame.instruction, destInstructions + instructionsOffset);

    // Finish by installing it on the definition.
    gcFrame.definition->bytecode = (sysbvm_tuple_t)gcFrame.bytecode;
    gcFrame.definition->sourceAnalyzedDefinition = SYSBVM_NULL_TUPLE;

    gcFrame.bytecode->debugSourcePositions = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourcePositions);
    gcFrame.bytecode->debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourceEnvironments);
}